

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# te.hpp
# Opt level: O1

void __thiscall
te::v1::static_vtable<Drawable>::static_vtable(static_vtable<Drawable> *this,size_t size)

{
  int iVar1;
  __uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true> __s;
  ulong __n;
  
  this->vtable_ = (ptr_t *)0x0;
  if (static_vtable(unsigned_long)::vtable == '\0') {
    iVar1 = __cxa_guard_acquire(&static_vtable(unsigned_long)::vtable);
    if (iVar1 != 0) {
      __n = -(ulong)(size >> 0x3d != 0) | size << 3;
      __s.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
      super__Head_base<0UL,_void_**,_false>._M_head_impl =
           (__uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>)operator_new__(__n);
      memset((void *)__s.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                     super__Head_base<0UL,_void_**,_false>._M_head_impl,0,__n);
      static_vtable::vtable._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
      super__Head_base<0UL,_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
           (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
           __s.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
           super__Head_base<0UL,_void_**,_false>._M_head_impl;
      __cxa_atexit(std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr,
                   &static_vtable::vtable,&__dso_handle);
      __cxa_guard_release(&static_vtable(unsigned_long)::vtable);
    }
  }
  this->vtable_ =
       (ptr_t *)static_vtable::vtable._M_t.
                super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                super__Head_base<0UL,_void_**,_false>._M_head_impl;
  return;
}

Assistant:

explicit static_vtable(const std::size_t size) {
    static auto vtable = std::make_unique<ptr_t[]>(size);
    vtable_ = vtable.get();
  }